

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void int_cmov_test(void)

{
  int a;
  int r;
  int local_8 [2];
  
  local_8[0] = 0;
  local_8[1] = 0x7fffffff;
  secp256k1_int_cmov(local_8 + 1,local_8,0);
  if (local_8[1] != 0x7fffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d5e,"test condition failed: r == INT_MAX");
    abort();
  }
  local_8[1] = 0;
  local_8[0] = 0x7fffffff;
  secp256k1_int_cmov(local_8 + 1,local_8,1);
  if (local_8[1] != 0x7fffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d62,"test condition failed: r == INT_MAX");
    abort();
  }
  local_8[0] = 0;
  secp256k1_int_cmov(local_8 + 1,local_8,1);
  if (local_8[1] != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d66,"test condition failed: r == 0");
    abort();
  }
  local_8[0] = 1;
  secp256k1_int_cmov(local_8 + 1,local_8,1);
  if (local_8[1] != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d6a,"test condition failed: r == 1");
    abort();
  }
  local_8[0] = 0;
  local_8[1] = 1;
  secp256k1_int_cmov(local_8 + 1,local_8,0);
  if (local_8[1] != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d6e,"test condition failed: r == 1");
    abort();
  }
  return;
}

Assistant:

static void int_cmov_test(void) {
    int r = INT_MAX;
    int a = 0;

    secp256k1_int_cmov(&r, &a, 0);
    CHECK(r == INT_MAX);

    r = 0; a = INT_MAX;
    secp256k1_int_cmov(&r, &a, 1);
    CHECK(r == INT_MAX);

    a = 0;
    secp256k1_int_cmov(&r, &a, 1);
    CHECK(r == 0);

    a = 1;
    secp256k1_int_cmov(&r, &a, 1);
    CHECK(r == 1);

    r = 1; a = 0;
    secp256k1_int_cmov(&r, &a, 0);
    CHECK(r == 1);

}